

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

void Lowerer::GenerateLdFldFromProtoInlineCache
               (Instr *instrLdFld,RegOpnd *opndBase,Opnd *opndDst,RegOpnd *inlineCache,
               LabelInstr *labelFallThru,bool isInlineSlot)

{
  BYTE scale;
  DWORD offset;
  RegOpnd *pRVar1;
  IndirOpnd *pIVar2;
  RegOpnd *baseOpnd;
  undefined3 in_register_00000089;
  
  pRVar1 = IR::RegOpnd::New(TyInt64,instrLdFld->m_func);
  pIVar2 = IR::IndirOpnd::New(inlineCache,0x10,TyInt64,instrLdFld->m_func,false);
  InsertMove(&pRVar1->super_Opnd,&pIVar2->super_Opnd,instrLdFld,true);
  baseOpnd = pRVar1;
  if (CONCAT31(in_register_00000089,isInlineSlot) == 0) {
    baseOpnd = IR::RegOpnd::New(TyInt64,instrLdFld->m_func);
    offset = Js::DynamicObject::GetOffsetOfAuxSlots();
    pIVar2 = IR::IndirOpnd::New(pRVar1,offset,TyInt64,instrLdFld->m_func,false);
    InsertMove(&baseOpnd->super_Opnd,&pIVar2->super_Opnd,instrLdFld,true);
  }
  pRVar1 = IR::RegOpnd::New(TyInt64,instrLdFld->m_func);
  pIVar2 = IR::IndirOpnd::New(inlineCache,2,TyUint16,instrLdFld->m_func,false);
  InsertMove(&pRVar1->super_Opnd,&pIVar2->super_Opnd,instrLdFld,true);
  scale = LowererMDArch::GetDefaultIndirScale();
  pIVar2 = IR::IndirOpnd::New(baseOpnd,pRVar1,scale,TyInt64,instrLdFld->m_func);
  InsertMove(opndDst,&pIVar2->super_Opnd,instrLdFld,true);
  InsertBranch(Br,false,labelFallThru,instrLdFld);
  return;
}

Assistant:

void
Lowerer::GenerateLdFldFromProtoInlineCache(
    IR::Instr * instrLdFld,
    IR::RegOpnd * opndBase,
    IR::Opnd * opndDst,
    IR::RegOpnd * inlineCache,
    IR::LabelInstr * labelFallThru,
    bool isInlineSlot)
{
    // Generate:
    //
    // s1 = MOV [&(inlineCache->u.proto.prototypeObject)] -- load the cached prototype object
    // s1 = MOV [&s1->slots] -- load the slot array
    // s2 = MOVZXW [&(inlineCache->u.proto.slotIndex)] -- load the cached slot index
    // dst = MOV [s1 + s2*4]
    //      JMP $fallthru

    IR::IndirOpnd * opndIndir = nullptr;
    IR::RegOpnd * opndProtoSlots = nullptr;

    // s1 = MOV [&(inlineCache->u.proto.prototypeObject)] -- load the cached prototype object
    IR::RegOpnd * opndProto = IR::RegOpnd::New(TyMachReg, instrLdFld->m_func);
    opndIndir = IR::IndirOpnd::New(inlineCache, (int32)offsetof(Js::InlineCache, u.proto.prototypeObject), TyMachReg, instrLdFld->m_func);
    InsertMove(opndProto, opndIndir, instrLdFld);

    if (!isInlineSlot)
    {
        // s1 = MOV [&s1->slots] -- load the slot array
        opndProtoSlots = IR::RegOpnd::New(TyMachReg, instrLdFld->m_func);
        opndIndir = IR::IndirOpnd::New(opndProto, Js::DynamicObject::GetOffsetOfAuxSlots(), TyMachReg, instrLdFld->m_func);
        InsertMove(opndProtoSlots, opndIndir, instrLdFld);
    }

    // s2 = MOVZXW [&(inlineCache->u.proto.slotIndex)] -- load the cached slot index
    IR::RegOpnd * opndSlotIndex = IR::RegOpnd::New(TyMachReg, instrLdFld->m_func);
    opndIndir = IR::IndirOpnd::New(inlineCache, (int32)offsetof(Js::InlineCache, u.proto.slotIndex), TyUint16, instrLdFld->m_func);
    InsertMove(opndSlotIndex, opndIndir, instrLdFld);

    if (isInlineSlot)
    {
        // dst = MOV [s1 + s2*4]
        opndIndir = IR::IndirOpnd::New(opndProto, opndSlotIndex, LowererMD::GetDefaultIndirScale(), TyMachReg, instrLdFld->m_func);
        InsertMove(opndDst, opndIndir, instrLdFld);
    }
    else
    {
        // dst = MOV [s1 + s2*4]
        opndIndir = IR::IndirOpnd::New(opndProtoSlots, opndSlotIndex, LowererMD::GetDefaultIndirScale(), TyMachReg, instrLdFld->m_func);
        InsertMove(opndDst, opndIndir, instrLdFld);
    }

    // JMP $fallthru
    InsertBranch(Js::OpCode::Br, labelFallThru, instrLdFld);
}